

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.cpp
# Opt level: O1

void __thiscall
LocalBGValueFunctionVector::LocalBGValueFunctionVector
          (LocalBGValueFunctionVector *this,
          shared_ptr<const_BayesianGameCollaborativeGraphical> *cgbg,Scope *agentScope)

{
  Index *pIVar1;
  iterator __position;
  Index IVar2;
  LIndex i;
  Index *pIVar3;
  size_t polsThisAg;
  allocator_type local_59;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> local_50;
  value_type_conflict3 local_38;
  
  (this->super_LocalBGValueFunctionInterface)._vptr_LocalBGValueFunctionInterface =
       (_func_int **)&PTR__LocalBGValueFunctionVector_005a1ae8;
  local_58 = &this->_m_values;
  (this->_m_agentScope).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_agentScope).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_agentScope).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_bgcg).px = (element_type *)0x0;
  (this->_m_bgcg).pn.pi_ = (sp_counted_base *)0x0;
  (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_bgcg).px = (element_type *)0x0;
  (this->_m_bgcg).pn.pi_ = (sp_counted_base *)0x0;
  (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrIndivPols).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrIndivPols).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrIndivPols).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this->_m_agentScope).super_SDT,&agentScope->super_SDT);
  boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator=(&this->_m_bgcg,cgbg);
  this->_m_nrJointPols = 1;
  pIVar3 = (this->_m_agentScope).super_SDT.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar1 = (this->_m_agentScope).super_SDT.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pIVar3 != pIVar1) {
    do {
      i = Interface_ProblemToPolicyDiscretePure::GetNrPolicies
                    ((Interface_ProblemToPolicyDiscretePure *)(this->_m_bgcg).px,*pIVar3,TYPE_INDEX,
                     999999);
      IVar2 = Globals::CastLIndexToIndex(i);
      local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(ulong)IVar2;
      this->_m_nrJointPols =
           this->_m_nrJointPols *
           (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      __position._M_current =
           (this->_m_nrIndivPols).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_m_nrIndivPols).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_m_nrIndivPols,
                   __position,(unsigned_long *)&local_50);
      }
      else {
        *__position._M_current =
             (unsigned_long)
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        (this->_m_nrIndivPols).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar1);
  }
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,this->_m_nrJointPols,&local_38,&local_59);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(local_58,&local_50);
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

LocalBGValueFunctionVector::LocalBGValueFunctionVector(
        const boost::shared_ptr<const BayesianGameCollaborativeGraphical> &cgbg, 
         Scope agentScope)
{
    _m_agentScope = agentScope;
    _m_bgcg = cgbg;

    //    we fill _m_nrIndivPols; and compute
    _m_nrJointPols = 1;
    Scope::iterator it = _m_agentScope.begin();
    Scope::iterator last = _m_agentScope.end();
    while(it != last)
    {
        Index agI = *it;
        size_t polsThisAg = CastLIndexToIndex(_m_bgcg->GetNrPolicies(agI));
        _m_nrJointPols *= polsThisAg;
        _m_nrIndivPols.push_back(polsThisAg);
        it++;
    }
    _m_values = vector<double>(_m_nrJointPols, 0.0);   
}